

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

StringTree * capnp::compiler::tupleLiteral(Reader params)

{
  Reader exp;
  bool bVar1;
  uint uVar2;
  StringTree *pSVar3;
  StringTree *in_RDI;
  StringTree *in_R8;
  Iterator IVar4;
  ArrayPtr<const_char> AVar5;
  undefined8 in_stack_fffffffffffffdb8;
  ArrayPtr<const_char> local_1f8;
  Array<kj::StringTree> local_1e8;
  StringTree local_1d0;
  Reader local_198;
  ArrayPtr<const_char> local_168;
  StringTree local_158;
  Reader local_120;
  undefined1 local_f0 [8];
  StringTree part;
  Reader param;
  undefined1 local_78 [8];
  Iterator __end2;
  undefined1 local_48 [8];
  Iterator __begin2;
  Reader *__range2;
  ArrayBuilder<kj::StringTree> parts;
  
  uVar2 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&stack0x00000008);
  kj::heapArrayBuilder<kj::StringTree>((ArrayBuilder<kj::StringTree> *)&__range2,(ulong)uVar2);
  __begin2._8_8_ = (Reader *)&stack0x00000008;
  IVar4 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)&stack0x00000008);
  __end2._8_8_ = IVar4.container;
  __begin2.container._0_4_ = IVar4.index;
  local_48 = (undefined1  [8])__end2._8_8_;
  IVar4 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::end
                    ((Reader *)__begin2._8_8_);
  local_78 = (undefined1  [8])IVar4.container;
  __end2.container._0_4_ = IVar4.index;
  while( true ) {
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                          *)local_48,
                         (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                          *)local_78);
    if (!bVar1) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator*((Reader *)&part.branches.disposer,
                (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                 *)local_48);
    Expression::Param::Reader::getValue(&local_120,(Reader *)&part.branches.disposer);
    exp._reader.capTable = (CapTableReader *)local_120._reader.data;
    exp._reader.segment = (SegmentReader *)local_120._reader.capTable;
    exp._reader.data = local_120._reader.pointers;
    exp._reader.pointers = (WirePointer *)local_120._reader._32_8_;
    exp._reader.dataSize = local_120._reader.nestingLimit;
    exp._reader.pointerCount = local_120._reader._44_2_;
    exp._reader._38_2_ = local_120._reader._46_2_;
    exp._reader._40_8_ = in_stack_fffffffffffffdb8;
    expressionStringTree(exp);
    bVar1 = Expression::Param::Reader::isNamed((Reader *)&part.branches.disposer);
    if (bVar1) {
      Expression::Param::Reader::getNamed(&local_198,(Reader *)&part.branches.disposer);
      AVar5 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_198);
      local_168 = AVar5;
      pSVar3 = kj::mv<kj::StringTree>((StringTree *)local_f0);
      kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                (&local_158,(kj *)&local_168,(Reader *)" = ",(char (*) [4])pSVar3,in_R8);
      kj::StringTree::operator=((StringTree *)local_f0,&local_158);
      kj::StringTree::~StringTree(&local_158);
    }
    pSVar3 = kj::mv<kj::StringTree>((StringTree *)local_f0);
    kj::ArrayBuilder<kj::StringTree>::add<kj::StringTree>
              ((ArrayBuilder<kj::StringTree> *)&__range2,pSVar3);
    kj::StringTree::~StringTree((StringTree *)local_f0);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                  *)local_48);
  }
  kj::ArrayBuilder<kj::StringTree>::finish(&local_1e8,(ArrayBuilder<kj::StringTree> *)&__range2);
  kj::StringPtr::StringPtr((StringPtr *)&local_1f8,", ");
  kj::StringTree::StringTree(&local_1d0,&local_1e8,(StringPtr)local_1f8);
  kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
            (in_RDI,(kj *)"( ",(char (*) [3])&local_1d0,(StringTree *)0xa4644f,(char (*) [3])in_R8);
  kj::StringTree::~StringTree(&local_1d0);
  kj::Array<kj::StringTree>::~Array(&local_1e8);
  kj::ArrayBuilder<kj::StringTree>::~ArrayBuilder((ArrayBuilder<kj::StringTree> *)&__range2);
  return in_RDI;
}

Assistant:

static kj::StringTree tupleLiteral(List<Expression::Param>::Reader params) {
  auto parts = kj::heapArrayBuilder<kj::StringTree>(params.size());
  for (auto param: params) {
    auto part = expressionStringTree(param.getValue());
    if (param.isNamed()) {
      part = kj::strTree(param.getNamed().getValue(), " = ", kj::mv(part));
    }
    parts.add(kj::mv(part));
  }
  return kj::strTree("( ", kj::StringTree(parts.finish(), ", "), " )");
}